

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O0

void save_json(path *root,string_view filename,json *dbjson)

{
  path *this;
  string_type *in_RDI;
  ofstream db_file;
  string tmp_db_name;
  path *in_stack_fffffffffffffbf8;
  path *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  path *this_00;
  path *in_stack_fffffffffffffc28;
  uint64_t in_stack_fffffffffffffc68;
  path local_358;
  int local_314;
  long local_310 [61];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffed8;
  ostream *in_stack_fffffffffffffee0;
  undefined1 local_100 [192];
  string local_40 [64];
  
  this_00 = (path *)local_100;
  random_hex_string_abi_cxx11_(in_stack_fffffffffffffc68);
  std::operator+(in_stack_fffffffffffffc08,&in_stack_fffffffffffffc00->_M_pathname);
  std::experimental::filesystem::v1::__cxx11::path::path(this_00,in_RDI);
  std::experimental::filesystem::v1::__cxx11::operator/(in_stack_fffffffffffffc28,this_00);
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            (in_stack_fffffffffffffbf8);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffc00);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffc00);
  std::__cxx11::string::~string((string *)(local_100 + 0x20));
  std::__cxx11::string::~string((string *)local_100);
  std::ofstream::ofstream(local_310);
  std::ios::exceptions((int)local_310 + (int)*(undefined8 *)(local_310[0] + -0x18));
  std::ofstream::open((string *)local_310,(_Ios_Openmode)local_40);
  local_314 = (int)std::setw(4);
  std::operator<<((ostream *)local_310,(_Setw)local_314);
  this = (path *)nlohmann::operator<<(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  std::ofstream::close();
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(this_00,in_RDI);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (this_00,(basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
  std::experimental::filesystem::v1::__cxx11::operator/(in_stack_fffffffffffffc28,this_00);
  std::experimental::filesystem::v1::rename(&local_358,(path *)&stack0xfffffffffffffc68);
  std::experimental::filesystem::v1::__cxx11::path::~path(this);
  std::experimental::filesystem::v1::__cxx11::path::~path(this);
  std::experimental::filesystem::v1::__cxx11::path::~path(this);
  std::ofstream::~ofstream(local_310);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void save_json(const fs::path &root, std::string_view filename,
               const json &dbjson) {
    std::string tmp_db_name = root / ("upgrade." + random_hex_string(8));
    std::ofstream db_file;
    db_file.exceptions(std::ofstream::badbit);
    db_file.open(tmp_db_name, std::ofstream::binary);
    db_file << std::setw(4) << dbjson << std::endl;
    db_file.flush();
    db_file.close();
    fs::rename(tmp_db_name, root / filename);
}